

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::apply
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
          *f)

{
  Index IVar1;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  double xmin;
  double xmax;
  VectorXd VVar2;
  undefined1 local_88 [16];
  Array<double,__1,_1,_0,__1,_1> local_78;
  Array<double,__1,_1,_0,__1,_1> local_68;
  NestedExpressionType local_58;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_0>
  local_50;
  vectype local_40;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_30;
  MatrixXd *V;
  Index Ndegree;
  function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
  *f_local;
  ChebyshevExpansion *this_local;
  
  Ndegree = (Index)f;
  f_local = (function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
             *)this;
  this_local = __return_storage_ptr__;
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  V = (MatrixXd *)(IVar1 - 1);
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
            LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,(size_t)V);
  IVar1 = Ndegree;
  local_30 = this_00;
  VVar2 = get_node_function_values((ChebyshevExpansion *)local_88);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Array<double,_1,1,0,_1,1> *)&local_78,(ChebyshevExpansion *)local_88,
             VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  std::
  function<Eigen::Array<double,_-1,_1,_0,_-1,_1>_(const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>::
  operator()((function<Eigen::Array<double,__1,_1,_0,__1,_1>_(const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
              *)&local_68,(Array<double,__1,_1,_0,__1,_1> *)IVar1);
  local_58 = (NestedExpressionType)
             Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::matrix
                       ((ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_68);
  local_50 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       (this_00,(MatrixBase<Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_58);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::Array<double,_1,1,0,_1,1>>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_40,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)&local_50);
  xmin = ChebyshevExpansion::xmin(this);
  xmax = ChebyshevExpansion::xmax(this);
  ChebyshevExpansion(__return_storage_ptr__,&local_40,xmin,xmax);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_40);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_68);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_78);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::apply(std::function<Eigen::ArrayXd(const Eigen::ArrayXd &)> &f) const{
        // 1. Transform Chebyshev-Lobatto node function values by the function f(y) -> y2
        // 2. Go backwards to coefficients from node values c2 = V*y2
        const auto Ndegree = m_c.size()-1;
        const Eigen::MatrixXd &V = l_matrix_library.get(Ndegree);
        return ChebyshevExpansion(V*f(get_node_function_values()).matrix(), xmin(), xmax());
    }